

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O2

void __thiscall icu_63::OlsonTimeZone::constructEmpty(OlsonTimeZone *this)

{
  this->canonicalID = (UChar *)0x0;
  this->transitionCountPost32 = 0;
  this->transitionCountPre32 = 0;
  this->transitionCount32 = 0;
  this->typeMapData = (uint8_t *)0x0;
  this->finalZone = (SimpleTimeZone *)0x0;
  this->transitionTimesPost32 = (int32_t *)0x0;
  this->transitionTimesPre32 = (int32_t *)0x0;
  this->transitionTimes32 = (int32_t *)0x0;
  this->typeCount = 1;
  this->typeOffsets = (int32_t *)&ZEROS;
  return;
}

Assistant:

void OlsonTimeZone::constructEmpty() {
    canonicalID = NULL;

    transitionCountPre32 = transitionCount32 = transitionCountPost32 = 0;
    transitionTimesPre32 = transitionTimes32 = transitionTimesPost32 = NULL;

    typeMapData = NULL;

    typeCount = 1;
    typeOffsets = ZEROS;

    finalZone = NULL;
}